

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibUtil.c
# Opt level: O3

void Abc_SclShortNames(SC_Lib *p)

{
  SC_Cell *pSVar1;
  void *pvVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  SC_Cell *pCell;
  SC_Cell *pSVar9;
  size_t sVar10;
  char *pcVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  char cVar15;
  long lVar16;
  uint uVar17;
  int Count;
  uint uVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  char Buffer [10000];
  uint local_2794;
  char local_2748 [10008];
  
  uVar18 = (p->vCellClasses).nSize;
  uVar17 = 0;
  if (0 < (int)uVar18) {
    uVar17 = uVar18;
  }
  if (1 < (int)uVar18) {
    uVar6 = uVar17 - 1;
    uVar17 = 0;
    do {
      uVar17 = uVar17 + 1;
      bVar5 = 9 < uVar6;
      uVar6 = uVar6 / 10;
    } while (bVar5);
  }
  if (0 < (int)uVar18) {
    lVar13 = 0;
    do {
      pSVar1 = (SC_Cell *)(p->vCellClasses).pArray[lVar13];
      uVar18 = 0;
      pSVar9 = pSVar1;
      do {
        uVar18 = uVar18 + (pSVar9->fSkip == 0);
        pSVar9 = pSVar9->pNext;
      } while (pSVar9 != pSVar1);
      if (1 < uVar18) {
        uVar6 = uVar18 - 1;
        uVar18 = 0;
        do {
          uVar18 = uVar18 + 1;
          bVar5 = 9 < uVar6;
          uVar6 = uVar6 / 10;
        } while (bVar5);
      }
      local_2794 = 0;
      pSVar9 = pSVar1;
      do {
        if (pSVar9->pName != (char *)0x0) {
          free(pSVar9->pName);
          pSVar9->pName = (char *)0x0;
        }
        sprintf(local_2748,"g%0*d_%0*d",(ulong)uVar17,lVar13,(ulong)uVar18,(ulong)local_2794);
        sVar10 = strlen(local_2748);
        pcVar11 = (char *)malloc(sVar10 + 1);
        strcpy(pcVar11,local_2748);
        pSVar9->pName = pcVar11;
        iVar8 = (pSVar9->vPins).nSize;
        uVar6 = pSVar9->n_inputs;
        uVar14 = (ulong)uVar6;
        if ((int)uVar6 < iVar8) {
          do {
            if ((int)uVar6 < 0) goto LAB_003efde2;
            pvVar2 = (pSVar9->vPins).pArray[uVar14];
            if (0 < *(int *)((long)pvVar2 + 0x44)) {
              iVar8 = pSVar9->n_inputs;
              lVar12 = 0;
              do {
                puVar3 = *(undefined8 **)(*(long *)((long)pvVar2 + 0x48) + lVar12 * 8);
                iVar7 = *(int *)((long)puVar3 + 0xc);
                if (0 < iVar7) {
                  lVar16 = 0;
                  do {
                    if (0 < iVar8) {
                      puVar4 = *(undefined8 **)(puVar3[2] + lVar16 * 8);
                      lVar19 = 0;
                      do {
                        if ((pSVar9->vPins).nSize <= lVar19) goto LAB_003efde2;
                        pcVar11 = (char *)*puVar4;
                        if ((pcVar11 != (char *)0x0) &&
                           (iVar7 = strcmp(pcVar11,*(pSVar9->vPins).pArray[lVar19]), iVar7 == 0)) {
                          free(pcVar11);
                          local_2748[0] = (char)lVar19 + 'a';
                          local_2748[1] = 0;
                          sVar10 = strlen(local_2748);
                          pcVar11 = (char *)malloc(sVar10 + 1);
                          strcpy(pcVar11,local_2748);
                          *puVar4 = pcVar11;
                          iVar8 = pSVar9->n_inputs;
                        }
                        lVar19 = lVar19 + 1;
                      } while (lVar19 < iVar8);
                      iVar7 = *(int *)((long)puVar3 + 0xc);
                    }
                    lVar16 = lVar16 + 1;
                  } while (lVar16 < iVar7);
                }
                if (0 < iVar8) {
                  lVar16 = 0;
                  do {
                    if ((pSVar9->vPins).nSize <= lVar16) goto LAB_003efde2;
                    pcVar11 = (char *)*puVar3;
                    if ((pcVar11 != (char *)0x0) &&
                       (iVar7 = strcmp(pcVar11,*(pSVar9->vPins).pArray[lVar16]), iVar7 == 0)) {
                      free(pcVar11);
                      local_2748[0] = (char)lVar16 + 'a';
                      local_2748[1] = 0;
                      sVar10 = strlen(local_2748);
                      pcVar11 = (char *)malloc(sVar10 + 1);
                      strcpy(pcVar11,local_2748);
                      *puVar3 = pcVar11;
                      iVar8 = pSVar9->n_inputs;
                    }
                    lVar16 = lVar16 + 1;
                  } while (lVar16 < iVar8);
                }
                lVar12 = lVar12 + 1;
              } while (lVar12 < *(int *)((long)pvVar2 + 0x44));
            }
            Abc_SclShortFormula(pSVar9,*(char **)((long)pvVar2 + 0x28),local_2748);
            if (*(void **)((long)pvVar2 + 0x28) != (void *)0x0) {
              free(*(void **)((long)pvVar2 + 0x28));
            }
            sVar10 = strlen(local_2748);
            pcVar11 = (char *)malloc(sVar10 + 1);
            strcpy(pcVar11,local_2748);
            *(char **)((long)pvVar2 + 0x28) = pcVar11;
            uVar14 = uVar14 + 1;
            iVar8 = (pSVar9->vPins).nSize;
          } while ((int)uVar14 < iVar8);
          uVar14 = (ulong)(uint)pSVar9->n_inputs;
        }
        if (0 < (int)uVar14) {
          lVar12 = 0;
          do {
            if ((pSVar9->vPins).nSize <= lVar12) goto LAB_003efde2;
            puVar3 = (undefined8 *)(pSVar9->vPins).pArray[lVar12];
            pvVar2 = (void *)*puVar3;
            if (pvVar2 != (void *)0x0) {
              free(pvVar2);
            }
            local_2748[0] = (char)lVar12 + 'a';
            local_2748[1] = 0;
            sVar10 = strlen(local_2748);
            pcVar11 = (char *)malloc(sVar10 + 1);
            strcpy(pcVar11,local_2748);
            *puVar3 = pcVar11;
            lVar12 = lVar12 + 1;
            uVar14 = (ulong)pSVar9->n_inputs;
          } while (lVar12 < (long)uVar14);
          iVar8 = (pSVar9->vPins).nSize;
        }
        if ((int)uVar14 < iVar8) {
          uVar20 = uVar14 & 0xffffffff;
          cVar15 = 'z' - (char)uVar14;
          uVar21 = uVar14 & 0xffffffff;
          do {
            if ((int)uVar14 < 0) {
LAB_003efde2:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            puVar3 = (undefined8 *)(pSVar9->vPins).pArray[uVar20];
            pvVar2 = (void *)*puVar3;
            if (pvVar2 != (void *)0x0) {
              free(pvVar2);
            }
            local_2748[0] = (char)pSVar9->n_inputs + cVar15;
            local_2748[1] = 0;
            sVar10 = strlen(local_2748);
            pcVar11 = (char *)malloc(sVar10 + 1);
            strcpy(pcVar11,local_2748);
            *puVar3 = pcVar11;
            uVar20 = uVar20 + 1;
            cVar15 = cVar15 + -1;
            uVar6 = (int)uVar21 + 1;
            uVar21 = (ulong)uVar6;
          } while ((int)uVar6 < (pSVar9->vPins).nSize);
        }
        pSVar9 = pSVar9->pNext;
        local_2794 = local_2794 + 1;
      } while (pSVar9 != pSVar1);
      lVar13 = lVar13 + 1;
    } while (lVar13 < (p->vCellClasses).nSize);
  }
  p->nBins = 0;
  if (p->pBins != (int *)0x0) {
    free(p->pBins);
    p->pBins = (int *)0x0;
  }
  Abc_SclHashCells(p);
  printf("Renaming library \"%s\" into \"%s%d\".\n",p->pName,"lib",(ulong)(uint)(p->vCells).nSize);
  if (p->pName != (char *)0x0) {
    free(p->pName);
    p->pName = (char *)0x0;
  }
  sprintf(local_2748,"lib%d",(ulong)(uint)(p->vCells).nSize);
  sVar10 = strlen(local_2748);
  pcVar11 = (char *)malloc(sVar10 + 1);
  strcpy(pcVar11,local_2748);
  p->pName = pcVar11;
  return;
}

Assistant:

void Abc_SclShortNames( SC_Lib * p )
{
    char Buffer[10000];
    SC_Cell * pClass, * pCell; SC_Pin * pPin;
    int i, k, n, nClasses = Abc_SclLibClassNum(p);
    int nDigits = Abc_Base10Log( nClasses );
    // itereate through classes
    SC_LibForEachCellClass( p, pClass, i )
    {
        int nDigits2 = Abc_Base10Log( Abc_SclClassCellNum(pClass) );
        SC_RingForEachCell( pClass, pCell, k )
        {
            ABC_FREE( pCell->pName );
            sprintf( Buffer, "g%0*d_%0*d", nDigits, i, nDigits2, k );
            pCell->pName = Abc_UtilStrsav( Buffer );
            // formula
            SC_CellForEachPinOut( pCell, pPin, n )
                Abc_SclPinUpdate( pCell, pPin, Buffer );
            // pin names
            SC_CellForEachPinIn( pCell, pPin, n )
            {
                ABC_FREE( pPin->pName );
                sprintf( Buffer, "%c", 'a'+n );
                pPin->pName = Abc_UtilStrsav( Buffer );
            }
            SC_CellForEachPinOut( pCell, pPin, n )
            {
                ABC_FREE( pPin->pName );
                sprintf( Buffer, "%c", 'z'-n+pCell->n_inputs );
                pPin->pName = Abc_UtilStrsav( Buffer );
            }
        }
    }
    p->nBins = 0;
    ABC_FREE( p->pBins );
    Abc_SclHashCells( p );
    // update library name
    printf( "Renaming library \"%s\" into \"%s%d\".\n", p->pName, "lib", SC_LibCellNum(p) );
    ABC_FREE( p->pName );
    sprintf( Buffer, "lib%d", SC_LibCellNum(p) );
    p->pName = Abc_UtilStrsav( Buffer );
}